

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool operator_string_cmp(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *pgVar1;
  gravity_value_t value;
  gravity_value_t value_00;
  gravity_value_t value_01;
  gravity_class_t *pgVar2;
  int iVar3;
  gravity_fiber_t *fiber;
  gravity_string_t *s2;
  gravity_string_t *s1;
  char local_1058 [8];
  char _buffer [4096];
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 local_50;
  gravity_value_t v2;
  gravity_value_t v1;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  pgVar1 = (args->field_1).p;
  join_0x00000010_0x00000000_ = convert_value2string(vm,args[1]);
  pgVar2 = gravity_class_int;
  if (_buffer._4088_8_ == 0) {
    snprintf(local_1058,0x1000,"Unable to convert object to String");
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1058);
    value_01.field_1.n = 0;
    value_01.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_01,rindex);
    vm_local._7_1_ = false;
  }
  else if (_buffer._4088_8_ == 0) {
    value.field_1.n = -1;
    value.isa = gravity_class_int;
    gravity_vm_setslot(vm,value,rindex);
    vm_local._7_1_ = true;
  }
  else {
    iVar3 = strcmp((char *)pgVar1->objclass,(char *)(local_50.p)->objclass);
    value_00.field_1 =
         (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
         (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(long)iVar3;
    value_00.isa = pgVar2;
    gravity_vm_setslot(vm,value_00,rindex);
    vm_local._7_1_ = true;
  }
  return vm_local._7_1_;
}

Assistant:

static bool operator_string_cmp (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)

    DECLARE_2VARIABLES(v1, v2, 0, 1);
    INTERNAL_CONVERT_STRING(v2, true);

    if (VALUE_ISA_VALID(v2)) {
        gravity_string_t *s1 = VALUE_AS_STRING(v1);
        gravity_string_t *s2 = VALUE_AS_STRING(v2);
        RETURN_VALUE(VALUE_FROM_INT(strcmp(s1->s, s2->s)), rindex);
    }
    
    RETURN_VALUE(VALUE_FROM_INT(-1), rindex);
}